

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O2

bool __thiscall Quest_Context::CheckRule(Quest_Context *this,Expression *expr)

{
  byte bVar1;
  Gender GVar2;
  Character *pCVar3;
  bool bVar4;
  short sVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  mapped_type *pmVar9;
  reference pvVar10;
  size_type sVar11;
  int *piVar12;
  uint uVar13;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
  *this_00;
  long lVar14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  iterator *piVar15;
  bool bVar16;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_03;
  allocator_type local_1bc;
  allocator<char> local_1bb;
  allocator_type local_1ba;
  allocator<char> local_1b9;
  string function_name;
  undefined1 local_198 [96];
  string local_138;
  string local_118;
  string local_f8 [32];
  string local_d8 [32];
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_68;
  string local_48;
  
  if ((this->quest->quest->info).disabled != false) {
    return false;
  }
  std::__cxx11::string::string((string *)&function_name,(string *)&expr->function);
  bVar4 = std::operator==(&function_name,"always");
  bVar16 = true;
  if (bVar4) goto LAB_0016c83f;
  bVar4 = std::operator==(&function_name,"donedaily");
  if (bVar4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"d",(allocator<char> *)&local_b8);
    this_00 = &this->progress;
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[](this_00,(key_type *)local_198);
    sVar5 = *pmVar9;
    iVar6 = quest_day();
    std::__cxx11::string::~string((string *)local_198);
    if (iVar6 == sVar5) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_198,"c",(allocator<char> *)&local_b8);
      pmVar9 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](this_00,(key_type *)local_198);
      sVar5 = *pmVar9;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (&(expr->args).
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start,0);
      iVar6 = util::variant::GetInt(pvVar10);
      bVar16 = iVar6 <= sVar5;
      __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
      goto LAB_0016c6f1;
    }
    iVar6 = quest_day();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"d",(allocator<char> *)&local_b8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[](this_00,(key_type *)local_198);
    *pmVar9 = (mapped_type)iVar6;
    std::__cxx11::string::~string((string *)local_198);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_198,"c",(allocator<char> *)&local_b8);
    pmVar9 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
             ::operator[](this_00,(key_type *)local_198);
    *pmVar9 = 0;
    std::__cxx11::string::~string((string *)local_198);
LAB_0016c83d:
    bVar16 = false;
    goto LAB_0016c83f;
  }
  bVar4 = std::operator==(&function_name,"entermap");
  if (bVar4) {
    uVar13 = (uint)this->character->map->id;
    pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                        (&(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start,0);
    uVar7 = util::variant::GetInt(pvVar10);
    goto LAB_0016c735;
  }
  bVar4 = std::operator==(&function_name,"entercoord");
  if (bVar4) {
    sVar5 = this->character->map->id;
    piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
               .super__Deque_impl_data._M_start;
    pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                        (piVar15,0);
    iVar6 = util::variant::GetInt(pvVar10);
    if (iVar6 == sVar5) {
      bVar1 = this->character->x;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (piVar15,1);
      uVar7 = util::variant::GetInt(pvVar10);
      if (uVar7 == bVar1) {
        uVar13 = (uint)this->character->y;
        pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                            (piVar15,2);
        uVar7 = util::variant::GetInt(pvVar10);
        goto LAB_0016c735;
      }
    }
    goto LAB_0016c83d;
  }
  bVar4 = std::operator==(&function_name,"leavemap");
  if (bVar4) {
    uVar13 = (uint)this->character->map->id;
    pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                        (&(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start,0);
    uVar7 = util::variant::GetInt(pvVar10);
LAB_0016c895:
    bVar16 = uVar7 == uVar13;
  }
  else {
    bVar4 = std::operator==(&function_name,"leavecoord");
    if (bVar4) {
      sVar5 = this->character->map->id;
      piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                 _M_impl.super__Deque_impl_data._M_start;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (piVar15,0);
      iVar6 = util::variant::GetInt(pvVar10);
      if (iVar6 != sVar5) goto LAB_0016c83f;
      bVar1 = this->character->x;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (piVar15,1);
      uVar7 = util::variant::GetInt(pvVar10);
      if (uVar7 != bVar1) goto LAB_0016c83f;
      uVar13 = (uint)this->character->y;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (piVar15,2);
      uVar7 = util::variant::GetInt(pvVar10);
      goto LAB_0016c895;
    }
    bVar4 = std::operator==(&function_name,"gotitems");
    if (bVar4) {
      pCVar3 = this->character;
      piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                 _M_impl.super__Deque_impl_data._M_start;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (piVar15,0);
      iVar6 = util::variant::GetInt(pvVar10);
      iVar8 = Character::HasItem(pCVar3,(short)iVar6,false);
      sVar11 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
      if (sVar11 < 2) {
        iVar6 = 1;
      }
      else {
        pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                            (piVar15,1);
        iVar6 = util::variant::GetInt(pvVar10);
      }
      bVar16 = SBORROW4(iVar8,iVar6);
      iVar8 = iVar8 - iVar6;
LAB_0016cab2:
      bVar16 = bVar16 == iVar8 < 0;
      goto LAB_0016c83f;
    }
    bVar4 = std::operator==(&function_name,"lostitems");
    if (bVar4) {
      pCVar3 = this->character;
      piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                 _M_impl.super__Deque_impl_data._M_start;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (piVar15,0);
      iVar6 = util::variant::GetInt(pvVar10);
      iVar6 = Character::HasItem(pCVar3,(short)iVar6,false);
      sVar11 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
      if (sVar11 < 2) {
        iVar8 = 1;
      }
      else {
        pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                            (piVar15,1);
        iVar8 = util::variant::GetInt(pvVar10);
      }
      bVar16 = iVar6 < iVar8;
      goto LAB_0016c83f;
    }
    bVar4 = std::operator==(&function_name,"gotspell");
    if (bVar4) {
      pCVar3 = this->character;
      piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                 _M_impl.super__Deque_impl_data._M_start;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (piVar15,0);
      iVar6 = util::variant::GetInt(pvVar10);
      bVar4 = Character::HasSpell(pCVar3,(short)iVar6);
      if (bVar4) {
        sVar11 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
        if (1 < sVar11) {
          pCVar3 = this->character;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          iVar6 = util::variant::GetInt(pvVar10);
          sVar5 = Character::SpellLevel(pCVar3,(short)iVar6);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,1);
          iVar6 = util::variant::GetInt(pvVar10);
          bVar16 = iVar6 <= sVar5;
        }
        goto LAB_0016c83f;
      }
      goto LAB_0016c83d;
    }
    bVar16 = std::operator==(&function_name,"lostspell");
    if (bVar16) {
      pCVar3 = this->character;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (&(expr->args).
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start,0);
      iVar6 = util::variant::GetInt(pvVar10);
      bVar16 = Character::HasSpell(pCVar3,(short)iVar6);
      bVar16 = !bVar16;
      goto LAB_0016c83f;
    }
    bVar16 = std::operator==(&function_name,"isgender");
    if (bVar16) {
      GVar2 = this->character->gender;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (&(expr->args).
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start,0);
      iVar6 = util::variant::GetInt(pvVar10);
      bVar16 = GVar2 == (Gender)iVar6;
      goto LAB_0016c83f;
    }
    bVar16 = std::operator==(&function_name,"isclass");
    if (bVar16) {
      uVar13 = (uint)this->character->clas;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (&(expr->args).
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start,0);
      uVar7 = util::variant::GetInt(pvVar10);
LAB_0016c735:
      bVar16 = uVar7 == uVar13;
      goto LAB_0016c83f;
    }
    bVar16 = std::operator==(&function_name,"israce");
    if (bVar16) {
      uVar13 = (uint)this->character->race;
      pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                          (&(expr->args).
                            super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl
                            .super__Deque_impl_data._M_start,0);
      uVar7 = util::variant::GetInt(pvVar10);
      goto LAB_0016c735;
    }
    bVar16 = std::operator==(&function_name,"iswearing");
    if (!bVar16) {
      bVar16 = std::operator==(&function_name,"citizenof");
      if (bVar16) {
        pCVar3 = this->character;
        pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                            (&(expr->args).
                              super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                              _M_impl.super__Deque_impl_data._M_start,0);
        util::variant::GetString_abi_cxx11_((string *)local_198,pvVar10);
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_198;
        bVar16 = std::operator==(&pCVar3->home,__rhs);
      }
      else {
        bVar16 = std::operator==(&function_name,"rolled");
        if (bVar16) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_198,"r",(allocator<char> *)&local_b8);
          pmVar9 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
                   ::operator[](&this->progress,(key_type *)local_198);
          iVar6 = (int)*pmVar9;
          std::__cxx11::string::~string((string *)local_198);
          sVar11 = std::deque<util::variant,_std::allocator<util::variant>_>::size(&expr->args);
          piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          if (sVar11 < 2) {
            iVar8 = util::variant::GetInt(pvVar10);
            bVar16 = iVar8 == iVar6;
            goto LAB_0016c83f;
          }
          iVar8 = util::variant::GetInt(pvVar10);
          if (iVar8 <= iVar6) {
            pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                      operator[](piVar15,1);
            iVar8 = util::variant::GetInt(pvVar10);
            bVar16 = SBORROW4(iVar8,iVar6);
            iVar8 = iVar8 - iVar6;
            goto LAB_0016cab2;
          }
          goto LAB_0016c83d;
        }
        bVar16 = std::operator==(&function_name,"statis");
        if (bVar16) {
          piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,1);
          util::variant::GetString_abi_cxx11_((string *)local_198,pvVar10);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          util::variant::GetString_abi_cxx11_((string *)(local_198 + 0x20),pvVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_198 + 0x40),"=",&local_1bb);
          __l._M_len = 3;
          __l._M_array = (iterator)local_198;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_b8,__l,&local_1bc);
          bVar16 = rpn_char_eval(&local_b8,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_b8);
          lVar14 = 0x40;
          do {
            std::__cxx11::string::~string((string *)(local_198 + lVar14));
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != -0x20);
          goto LAB_0016c83f;
        }
        bVar16 = std::operator==(&function_name,"statnot");
        if (bVar16) {
          piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,1);
          util::variant::GetString_abi_cxx11_((string *)local_198,pvVar10);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          util::variant::GetString_abi_cxx11_((string *)(local_198 + 0x20),pvVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_198 + 0x40),"=",&local_1bb);
          __l_00._M_len = 3;
          __l_00._M_array = (iterator)local_198;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_b8,__l_00,&local_1bc);
          bVar16 = rpn_char_eval(&local_b8,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_b8);
          lVar14 = 0x40;
          do {
            std::__cxx11::string::~string((string *)(local_198 + lVar14));
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != -0x20);
          goto LAB_0016c83f;
        }
        bVar16 = std::operator==(&function_name,"statgreater");
        if (bVar16) {
          piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,1);
          util::variant::GetString_abi_cxx11_((string *)local_198,pvVar10);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          util::variant::GetString_abi_cxx11_((string *)(local_198 + 0x20),pvVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_198 + 0x40),">",&local_1bb);
          __l_01._M_len = 3;
          __l_01._M_array = (iterator)local_198;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_b8,__l_01,&local_1bc);
          bVar16 = rpn_char_eval(&local_b8,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_b8);
          lVar14 = 0x40;
          do {
            std::__cxx11::string::~string((string *)(local_198 + lVar14));
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != -0x20);
          goto LAB_0016c83f;
        }
        bVar16 = std::operator==(&function_name,"statless");
        if (bVar16) {
          piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,1);
          util::variant::GetString_abi_cxx11_((string *)local_198,pvVar10);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          util::variant::GetString_abi_cxx11_((string *)(local_198 + 0x20),pvVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_198 + 0x40),"<",&local_1bb);
          __l_02._M_len = 3;
          __l_02._M_array = (iterator)local_198;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_b8,__l_02,&local_1bc);
          bVar16 = rpn_char_eval(&local_b8,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_b8);
          lVar14 = 0x40;
          do {
            std::__cxx11::string::~string((string *)(local_198 + lVar14));
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != -0x20);
          goto LAB_0016c83f;
        }
        bVar16 = std::operator==(&function_name,"statbetween");
        if (bVar16) {
          piVar15 = &(expr->args).super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                     _M_impl.super__Deque_impl_data._M_start;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,1);
          util::variant::GetString_abi_cxx11_((string *)local_198,pvVar10);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          util::variant::GetString_abi_cxx11_((string *)(local_198 + 0x20),pvVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)(local_198 + 0x40),"gte",&local_1bb);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,2);
          util::variant::GetString_abi_cxx11_(&local_138,pvVar10);
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](piVar15,0);
          util::variant::GetString_abi_cxx11_(&local_118,pvVar10);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_f8,"lte",(allocator<char> *)&local_1bc);
          std::__cxx11::string::string<std::allocator<char>>(local_d8,"and",&local_1b9);
          __l_03._M_len = 7;
          __l_03._M_array = (iterator)local_198;
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::deque(&local_b8,__l_03,&local_1ba);
          bVar16 = rpn_char_eval(&local_b8,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque(&local_b8);
          lVar14 = 0xc0;
          do {
            std::__cxx11::string::~string((string *)(local_198 + lVar14));
            lVar14 = lVar14 + -0x20;
          } while (lVar14 != -0x20);
          goto LAB_0016c83f;
        }
        bVar16 = std::operator==(&function_name,"statrpn");
        if (bVar16) {
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](&(expr->args).
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start,0);
          util::variant::GetString_abi_cxx11_(&local_48,pvVar10);
          util::rpn_parse((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_198,&local_48);
          bVar16 = rpn_char_eval((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_198,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_198);
          __rhs = &local_48;
        }
        else {
          bVar16 = std::operator==(&function_name,"stateval");
          if (!bVar16) goto LAB_0016c83d;
          pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::
                    operator[](&(expr->args).
                                super__Deque_base<util::variant,_std::allocator<util::variant>_>.
                                _M_impl.super__Deque_impl_data._M_start,0);
          util::variant::GetString_abi_cxx11_(&local_68,pvVar10);
          util::rpn_parse_v2((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_198,&local_68);
          bVar16 = rpn_char_eval((stack<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)local_198,this->character);
          std::
          deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_198);
          __rhs = &local_68;
        }
      }
LAB_0016c6f1:
      std::__cxx11::string::~string((string *)__rhs);
      goto LAB_0016c83f;
    }
    pCVar3 = this->character;
    pvVar10 = std::_Deque_iterator<util::variant,_util::variant_&,_util::variant_*>::operator[]
                        (&(expr->args).
                          super__Deque_base<util::variant,_std::allocator<util::variant>_>._M_impl.
                          super__Deque_impl_data._M_start,0);
    local_198._0_4_ = util::variant::GetInt(pvVar10);
    piVar12 = std::__find_if<int_const*,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                        (&pCVar3->paperdoll,&pCVar3->cosmetic_paperdoll);
    bVar16 = (array<int,_15UL> *)piVar12 == &this->character->cosmetic_paperdoll;
  }
  bVar16 = !bVar16;
LAB_0016c83f:
  std::__cxx11::string::~string((string *)&function_name);
  return bVar16;
}

Assistant:

bool Quest_Context::CheckRule(const EOPlus::Expression& expr)
{
	if (this->quest->Disabled())
		return false;

	std::string function_name = expr.function;

	if (function_name == "always")
	{
		return true;
	}
	else if (function_name == "donedaily")
	{
		if (this->progress["d"] == quest_day())
		{
			return this->progress["c"] >= int(expr.args[0]);
		}
		else
		{
			this->progress["d"] = quest_day();
			this->progress["c"] = 0;
			return false;
		}
	}
	else if (function_name == "entermap")
	{
		return this->character->map->id == int(expr.args[0]);
	}
	else if (function_name == "entercoord")
	{
		return this->character->map->id == int(expr.args[0])
		    && this->character->x == int(expr.args[1])
		    && this->character->y == int(expr.args[2]);
	}
	else if (function_name == "leavemap")
	{
		return this->character->map->id != int(expr.args[0]);
	}
	else if (function_name == "leavecoord")
	{
		return this->character->map->id != int(expr.args[0])
		    || this->character->x != int(expr.args[1])
		    || this->character->y != int(expr.args[2]);
	}
	else if (function_name == "gotitems")
	{
		return this->character->HasItem(int(expr.args[0])) >= (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "lostitems")
	{
		return this->character->HasItem(int(expr.args[0])) < (expr.args.size() >= 2 ? int(expr.args[1]) : 1);
	}
	else if (function_name == "gotspell")
	{
		return this->character->HasSpell(int(expr.args[0]))
		    && (expr.args.size() < 2 || this->character->SpellLevel(int(expr.args[0])) >= int(expr.args[1]));
	}
	else if (function_name == "lostspell")
	{
		return !this->character->HasSpell(int(expr.args[0]));
	}
	else if (function_name == "isgender")
	{
		return this->character->gender == Gender(int(expr.args[0]));
	}
	else if (function_name == "isclass")
	{
		return this->character->clas == int(expr.args[0]);
	}
	else if (function_name == "israce")
	{
		return this->character->race == int(expr.args[0]);
	}
	else if (function_name == "iswearing")
	{
		return std::find(UTIL_CRANGE(this->character->paperdoll), int(expr.args[0])) != this->character->paperdoll.end();
	}
	else if (function_name == "citizenof")
	{
		return this->character->home == std::string(expr.args[0]);
	}
	else if (function_name == "rolled")
	{
		int roll = this->progress["r"];

		if (expr.args.size() < 2)
		{
			return roll == int(expr.args[0]);
		}
		else
		{
			return roll >= int(expr.args[0])
			    && roll <= int(expr.args[1]);
		}
	}
	else if (function_name == "statis")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statnot")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "="}, character);
	}
	else if (function_name == "statgreater")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], ">"}, character);
	}
	else if (function_name == "statless")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "<"}, character);
	}
	else if (function_name == "statbetween")
	{
		return rpn_char_eval({expr.args[1], expr.args[0], "gte", expr.args[2], expr.args[0], "lte", "and"}, character);
	}
	else if (function_name == "statrpn")
	{
		return rpn_char_eval(util::rpn_parse(expr.args[0]), character);
	}
	else if (function_name == "stateval")
	{
		return rpn_char_eval(util::rpn_parse_v2(expr.args[0]), character);
	}

	return false;
}